

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

CharClass<char> * __thiscall
Centaurus::CharClass<char>::operator|=(CharClass<char> *this,Range<char> *r)

{
  Range<char> local_58;
  undefined1 local_48 [8];
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> local_40;
  vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_> local_28;
  
  local_58._vptr_Range = (_func_int **)&PTR__Range_001bcec0;
  local_58.m_start = r->m_start;
  local_58.m_end = r->m_end;
  operator|((CharClass<char> *)local_48,this,&local_58);
  local_28.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_40.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_28.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_28.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->m_ranges).
       super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_40.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_ranges).
  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_40.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_40.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
  _M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x20;
  local_40.super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector(&local_28);
  local_48 = (undefined1  [8])&PTR__CharClass_001bce90;
  std::vector<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>::~vector(&local_40);
  return this;
}

Assistant:

CharClass<TCHAR>& operator|=(const Range<TCHAR>& r)
    {
        return *this = *this | r;
    }